

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.h
# Opt level: O3

void __thiscall cnn::SimpleRNNBuilder::~SimpleRNNBuilder(SimpleRNNBuilder *this)

{
  pointer pEVar1;
  pointer pRVar2;
  
  (this->super_RNNBuilder)._vptr_RNNBuilder = (_func_int **)&PTR__SimpleRNNBuilder_002a2858;
  pEVar1 = (this->h0).
           super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pEVar1 != (pointer)0x0) {
    operator_delete(pEVar1);
  }
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::~vector(&this->h);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::~vector(&this->param_vars);
  std::
  vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
  ::~vector(&this->params);
  (this->super_RNNBuilder)._vptr_RNNBuilder = (_func_int **)&PTR__RNNBuilder_002a27e8;
  pRVar2 = (this->super_RNNBuilder).head.
           super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pRVar2 != (pointer)0x0) {
    operator_delete(pRVar2);
  }
  operator_delete(this);
  return;
}

Assistant:

SimpleRNNBuilder() = default;